

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::peekString(XMLReader *this,XMLCh *toPeek)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  XVar2 = XMLString::stringLen(toPeek);
  XVar3 = this->fCharIndex;
  uVar5 = this->fCharsAvail - XVar3;
  do {
    if (XVar2 <= uVar5) {
      iVar1 = bcmp(this->fCharBuf + XVar3,toPeek,XVar2 * 2);
      return iVar1 == 0;
    }
    refreshCharBuffer(this);
    XVar3 = this->fCharIndex;
    uVar4 = this->fCharsAvail - XVar3;
    bVar6 = uVar4 != uVar5;
    uVar5 = uVar4;
  } while (bVar6);
  return false;
}

Assistant:

bool XMLReader::peekString(const XMLCh* const toPeek)
{
    // Get the length of the string to skip
    const XMLSize_t srcLen = XMLString::stringLen(toPeek);

    //
    //  See if the current reader has enough chars to test against this
    //  string. If not, then ask it to reload its buffer. If that does not
    //  get us enough, then it cannot match.
    //
    //  NOTE: This works because strings never have to cross a reader! And
    //  a string to skip will never have a new line in it, so we will never
    //  miss adjusting the current line.
    //
    XMLSize_t charsLeft = charsLeftInBuffer();
    while (charsLeft < srcLen)
    {
         refreshCharBuffer();
         XMLSize_t t = charsLeftInBuffer();
         if (t == charsLeft)   // if the refreshCharBuf() did not add anything new
             return false;     //   give up and return.
         charsLeft = t;
	}




    //
    //  Ok, now we now that the current reader has enough chars in its
    //  buffer and that its index is back at zero. So we can do a quick and
    //  dirty comparison straight to its buffer with no requirement to unget
    //  if it fails.
    //
    if (memcmp(&fCharBuf[fCharIndex], toPeek, srcLen*sizeof(XMLCh)))
        return false;

    return true;
}